

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::ValueFlag<StringAssignable,_args::ValueReader>::ValueFlag
          (ValueFlag<StringAssignable,_args::ValueReader> *this,Group *group_,string *name_,
          string *help_,Matcher *matcher_,StringAssignable *defaultValue_,Options options_)

{
  pointer pcVar1;
  
  NamedBase::NamedBase((NamedBase *)this,name_,help_,options_);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__FlagBase_0021e5a8;
  Matcher::Matcher(&(this->super_ValueFlagBase).super_FlagBase.matcher,matcher_);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__ValueFlag_00220a88;
  (this->value).path._M_dataplus._M_p = (pointer)&(this->value).path.field_2;
  pcVar1 = (defaultValue_->path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + (defaultValue_->path)._M_string_length);
  (this->defaultValue).path._M_dataplus._M_p = (pointer)&(this->defaultValue).path.field_2;
  pcVar1 = (defaultValue_->path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->defaultValue,pcVar1,pcVar1 + (defaultValue_->path)._M_string_length);
  Group::Add(group_,(Base *)this);
  return;
}

Assistant:

ValueFlag(Group &group_, const std::string &name_, const std::string &help_, Matcher &&matcher_, const T &defaultValue_, Options options_): ValueFlagBase(name_, help_, std::move(matcher_), options_), value(defaultValue_), defaultValue(defaultValue_)
            {
                group_.Add(*this);
            }